

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O3

void __thiscall
OpenMD::InteractionManager::doPrePair(InteractionManager *this,InteractionData *idat)

{
  int iVar1;
  long lVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint uVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  if (idat->excluded == false) {
    iVar1 = idat->atid2;
    lVar2 = *(long *)&(this->iHash_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[idat->atid1].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
    uVar5 = *(uint *)(lVar2 + (long)iVar1 * 4);
    if ((uVar5 & 4) != 0) {
      peVar3 = (this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar3->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[7]
      )(peVar3,idat);
      uVar5 = *(uint *)(lVar2 + (long)iVar1 * 4);
    }
    if ((uVar5 & 8) != 0) {
      peVar4 = (this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar4->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[7]
      )(peVar4,idat);
      return;
    }
  }
  return;
}

Assistant:

void InteractionManager::doPrePair(InteractionData& idat) {
    if (!initialized_) initialize();

    // excluded interaction, so just return
    if (idat.excluded) return;

    int& iHash = iHash_[idat.atid1][idat.atid2];

    if ((iHash & EAM_INTERACTION) != 0) eam_->calcDensity(idat);
    if ((iHash & SC_INTERACTION) != 0) sc_->calcDensity(idat);

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[ idat.atypes ].begin();
    //      it != interactions_[ idat.atypes ].end(); ++it){
    //   if ((*it)->getFamily() == METALLIC_EMBEDDING_FAMILY) {
    //     dynamic_cast<MetallicInteraction*>(*it)->calcDensity(idat);
    //   }
    // }

    return;
  }